

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall duckdb::CSVErrorHandler::Insert(CSVErrorHandler *this,idx_t boundary_idx,idx_t rows)

{
  unordered_map<unsigned_long,_duckdb::LinesPerBoundary,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>_>
  *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  idx_t local_38;
  LinesPerBoundary local_30;
  
  local_38 = boundary_idx;
  ::std::mutex::lock(&this->main_mutex);
  this_00 = &this->lines_per_batch_map;
  iVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_38);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_false>.
      _M_cur == (__node_type *)0x0) {
    LinesPerBoundary::LinesPerBoundary(&local_30,local_38,rows);
    pmVar2 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_38);
    pmVar2->boundary_idx = local_30.boundary_idx;
    pmVar2->lines_in_batch = local_30.lines_in_batch;
  }
  else {
    pmVar2 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_38);
    pmVar2->lines_in_batch = pmVar2->lines_in_batch + rows;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::Insert(idx_t boundary_idx, idx_t rows) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (lines_per_batch_map.find(boundary_idx) == lines_per_batch_map.end()) {
		lines_per_batch_map[boundary_idx] = {boundary_idx, rows};
	} else {
		lines_per_batch_map[boundary_idx].lines_in_batch += rows;
	}
}